

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O3

void SUNGlobalFallbackErrHandler
               (int line,char *func,char *file,char *msgfmt,SUNErrCode err_code,...)

{
  char in_AL;
  char *pcVar1;
  size_t sVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *log_msg;
  char *local_110;
  va_list ap;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  ap[0].reg_save_area = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  log_msg = (char *)0x0;
  ap[0].gp_offset = 0x28;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  local_110 = func;
  local_c0 = in_R9;
  pcVar1 = (char *)malloc(0x6e);
  snprintf(pcVar1,0x6e,"%s:%d",
           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/sundials/sundials_errors.c"
           ,99);
  sunCreateLogMessage(SUN_LOGLEVEL_ERROR,0,pcVar1,"SUNGlobalFallbackErrHandler",
                      "The SUNDIALS SUNContext was corrupt or NULL when an error occurred. As such, error messages have been printed to stderr."
                      ,ap,&log_msg);
  fputs(log_msg,_stderr);
  free(log_msg);
  free(pcVar1);
  sVar2 = strlen(file);
  pcVar1 = (char *)malloc(sVar2 + 6);
  snprintf(pcVar1,sVar2 + 6,"%s:%d",file,(ulong)(uint)line);
  if (msgfmt == (char *)0x0) {
    msgfmt = SUNGetErrMsg(err_code);
  }
  sunCreateLogMessage(SUN_LOGLEVEL_ERROR,0,pcVar1,local_110,msgfmt,ap,&log_msg);
  fputs(log_msg,_stderr);
  free(log_msg);
  free(pcVar1);
  return;
}

Assistant:

void SUNGlobalFallbackErrHandler(int line, const char* func, const char* file,
                                 const char* msgfmt, SUNErrCode err_code, ...)
{
  va_list ap;
  char* log_msg       = NULL;
  char* file_and_line = NULL;

  va_start(ap, err_code);

  file_and_line = sunCombineFileAndLine(__LINE__, __FILE__);
  sunCreateLogMessage(SUN_LOGLEVEL_ERROR, 0, file_and_line,
                      __func__, "The SUNDIALS SUNContext was corrupt or NULL when an error occurred. As such, error messages have been printed to stderr.",
                      ap, &log_msg);
  fprintf(stderr, "%s", log_msg);
  free(log_msg);
  free(file_and_line);

  file_and_line = sunCombineFileAndLine(line, file);
  if (msgfmt == NULL) { msgfmt = SUNGetErrMsg(err_code); }
  sunCreateLogMessage(SUN_LOGLEVEL_ERROR, 0, file_and_line, func, msgfmt, ap,
                      &log_msg);
  fprintf(stderr, "%s", log_msg);
  free(log_msg);
  free(file_and_line);

  va_end(ap);
}